

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type * __thiscall
FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(value_type *__return_storage_ptr__,
            FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>
            *this,int i)

{
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_> local_b8;
  FadExpr<FadUnaryMin<Fad<double>_>_> local_a0;
  value_type local_98;
  value_type local_78;
  Fad<double> local_58;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_38;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  local_28;
  
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::fastAccessDx
            (&local_58,&this->right_->fadexpr_,i);
  local_b8.fadexpr_.left_ = &local_a0;
  local_b8.fadexpr_.right_.constant_ = (this->left_).constant_;
  local_b8.fadexpr_.right_.defaultVal = 0.0;
  local_a0.fadexpr_.expr_ = (FadUnaryMin<Fad<double>_>)(FadUnaryMin<Fad<double>_>)&local_58;
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_78,&this->right_->fadexpr_);
  FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>::val(&local_98,&this->right_->fadexpr_);
  local_28.fadexpr_.right_ = &local_38;
  local_38.fadexpr_.left_ = &local_78;
  local_38.fadexpr_.right_ = &local_98;
  local_28.fadexpr_.left_ = &local_b8;
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>>>,FadCst<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (__return_storage_ptr__,&local_28);
  Fad<double>::~Fad(&local_98);
  Fad<double>::~Fad(&local_78);
  Fad<double>::~Fad(&local_58);
  return __return_storage_ptr__;
}

Assistant:

value_type fastAccessDx(int i) const { return (- right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}